

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O2

void __thiscall CCharmapToUni8859_1::CCharmapToUni8859_1(CCharmapToUni8859_1 *this)

{
  wchar_t i;
  int iVar1;
  
  CCharmapToUniSB::CCharmapToUniSB(&this->super_CCharmapToUniSB);
  *(undefined ***)&(this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic =
       &PTR__CCharmap_00345f08;
  for (iVar1 = 0; iVar1 != 0x100; iVar1 = iVar1 + 1) {
    (**(code **)(*(long *)&(this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic + 0x38))
              (this,iVar1,iVar1);
  }
  return;
}

Assistant:

CCharmapToUni8859_1()
    {
        wchar_t i;
        
        /* 
         *   Initialize our mapping table.  Each 8859-1 code point maps to
         *   the same code point in Unicode, so this is a trivial
         *   translation.  
         */
        for (i = 0 ; i < 256 ; ++i)
            set_mapping(i, i);
    }